

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  bool bVar1;
  pointer pHVar2;
  iterator local_30;
  iterator DotToken;
  iterator Token;
  iterator *ScopeEnd_local;
  iterator *ScopeStart_local;
  ConversionStream *this_local;
  
  DotToken = (iterator)ScopeStart->_M_node;
  while( true ) {
    while( true ) {
      bVar1 = std::operator!=(&DotToken,ScopeEnd);
      if (!bVar1) {
        return;
      }
      pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&DotToken);
      bVar1 = std::operator==(&pHVar2->Literal,".");
      if (bVar1) break;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&DotToken);
    }
    local_30._M_node = DotToken._M_node;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&DotToken);
    bVar1 = std::operator==(&DotToken,ScopeEnd);
    if (bVar1) break;
    pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&DotToken);
    if (pHVar2->Type == Identifier) {
      bVar1 = ProcessObjectMethod(this,&local_30,ScopeStart,ScopeEnd);
      if (bVar1) {
        DotToken._M_node = local_30._M_node;
      }
    }
    else {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&DotToken);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods(const TokenListType::iterator& ScopeStart,
                                                                    const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        // Search for .identifier pattern

        if (Token->Literal == ".")
        {
            auto DotToken = Token;
            ++Token;
            if (Token == ScopeEnd)
                break;
            if (Token->Type == TokenType::Identifier)
            {
                if (ProcessObjectMethod(DotToken, ScopeStart, ScopeEnd))
                    Token = DotToken;
            }
            else
            {
                ++Token;
                continue;
            }
        }
        else
            ++Token;
    }
}